

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumStatement
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  Rep *pRVar1;
  bool bVar2;
  int iVar3;
  EnumOptions *pEVar4;
  EnumValueDescriptorProto *enum_value;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar2) {
    return true;
  }
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    LocationRecorder::Init(&LStack_48,enum_location,enum_location->source_code_info_);
    LocationRecorder::AddPath(&LStack_48,3);
    *(byte *)(enum_type->_has_bits_).has_bits_ = (byte)(enum_type->_has_bits_).has_bits_[0] | 2;
    if (enum_type->options_ == (EnumOptions *)0x0) {
      arena = (Arena *)(enum_type->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      pEVar4 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(arena);
      enum_type->options_ = pEVar4;
    }
    bVar2 = ParseOption(this,&enum_type->options_->super_Message,&LStack_48,containing_file,
                        OPTION_STATEMENT);
    goto LAB_00313373;
  }
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    bVar2 = ParseReserved(this,enum_type,enum_location);
    return bVar2;
  }
  LocationRecorder::LocationRecorder
            (&LStack_48,enum_location,2,(enum_type->value_).super_RepeatedPtrFieldBase.current_size_
            );
  pRVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_00313330:
    internal::RepeatedPtrFieldBase::Reserve
              (&(enum_type->value_).super_RepeatedPtrFieldBase,
               (enum_type->value_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0031333f:
    pRVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
    pRVar1->allocated_size = pRVar1->allocated_size + 1;
    enum_value = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                           ((enum_type->value_).super_RepeatedPtrFieldBase.arena_);
    pRVar1 = (enum_type->value_).super_RepeatedPtrFieldBase.rep_;
    iVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
    (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    pRVar1->elements[iVar3] = enum_value;
  }
  else {
    iVar3 = (enum_type->value_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar3) {
      if (pRVar1->allocated_size == (enum_type->value_).super_RepeatedPtrFieldBase.total_size_)
      goto LAB_00313330;
      goto LAB_0031333f;
    }
    (enum_type->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    enum_value = (EnumValueDescriptorProto *)pRVar1->elements[iVar3];
  }
  bVar2 = ParseEnumConstant(this,enum_value,&LStack_48,containing_file);
LAB_00313373:
  LocationRecorder::~LocationRecorder(&LStack_48);
  return bVar2;
}

Assistant:

bool Parser::ParseEnumStatement(EnumDescriptorProto* enum_type,
                                const LocationRecorder& enum_location,
                                const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("option")) {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kOptionsFieldNumber);
    return ParseOption(enum_type->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("reserved")) {
    return ParseReserved(enum_type, enum_location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kValueFieldNumber,
                              enum_type->value_size());
    return ParseEnumConstant(enum_type->add_value(), location, containing_file);
  }
}